

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000019cac0 = 0x2d2d2d2d2d2d2d;
    uRam000000000019cac7 = 0x2d2d2d2d2d2d2d2d;
    _DAT_0019cab0 = 0x2d2d2d2d2d2d2d2d;
    uRam000000000019cab8 = 0x2d2d2d2d2d2d2d;
    DAT_0019cabf = 0x2d;
    _DAT_0019caa0 = 0x2d2d2d2d2d2d2d2d;
    uRam000000000019caa8 = 0x2d2d2d2d2d2d2d2d;
    _DAT_0019ca90 = 0x2d2d2d2d2d2d2d2d;
    uRam000000000019ca98 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam000000000019ca88 = 0x2d2d2d2d2d2d2d2d;
    DAT_0019cacf = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void printSummaryDivider() {
            stream << getLineOfChars<'-'>() << "\n";
        }